

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_loadZstdDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_cwksp *ws,
                 ZSTD_CCtx_params *params,void *dict,size_t dictSize,ZSTD_dictTableLoadMethod_e dtlm
                 ,ZSTD_tableFillPurpose_e tfp,void *workspace)

{
  U32 UVar1;
  uint uVar2;
  size_t code;
  long in_RCX;
  ulong in_R9;
  size_t err_code_1;
  size_t dictContentSize;
  size_t err_code;
  size_t eSize;
  size_t dictID;
  BYTE *dictEnd;
  BYTE *dictPtr;
  size_t in_stack_00000100;
  void *in_stack_00000108;
  void *in_stack_00000110;
  ZSTD_compressedBlockState_t *in_stack_00000118;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint local_74;
  ulong local_8;
  
  if (in_R9 < 8) {
    __assert_fail("dictSize >= 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6402,
                  "size_t ZSTD_loadZstdDictionary(ZSTD_compressedBlockState_t *, ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e, void *)"
                 );
  }
  UVar1 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (UVar1 != 0xec30a437) {
    __assert_fail("MEM_readLE32(dictPtr) == ZSTD_MAGIC_DICTIONARY",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6403,
                  "size_t ZSTD_loadZstdDictionary(ZSTD_compressedBlockState_t *, ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e, void *)"
                 );
  }
  if (*(int *)(in_RCX + 0x28) == 0) {
    local_74 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    local_74 = 0;
  }
  local_8 = ZSTD_loadCEntropy(in_stack_00000118,in_stack_00000110,in_stack_00000108,
                              in_stack_00000100);
  uVar2 = ERR_isError(local_8);
  if (uVar2 == 0) {
    code = ZSTD_loadDictionaryContent
                     ((ZSTD_matchState_t *)dictPtr,(ldmState_t *)dictEnd,(ZSTD_cwksp *)dictID,
                      (ZSTD_CCtx_params *)eSize,(void *)err_code,dictContentSize,
                      (ZSTD_dictTableLoadMethod_e)params,(ZSTD_tableFillPurpose_e)ws);
    uVar2 = ERR_isError(code);
    local_8 = (ulong)local_74;
    if (uVar2 != 0) {
      local_8 = code;
    }
  }
  return local_8;
}

Assistant:

static size_t ZSTD_loadZstdDictionary(ZSTD_compressedBlockState_t* bs,
                                      ZSTD_matchState_t* ms,
                                      ZSTD_cwksp* ws,
                                      ZSTD_CCtx_params const* params,
                                      const void* dict, size_t dictSize,
                                      ZSTD_dictTableLoadMethod_e dtlm,
                                      ZSTD_tableFillPurpose_e tfp,
                                      void* workspace)
{
    const BYTE* dictPtr = (const BYTE*)dict;
    const BYTE* const dictEnd = dictPtr + dictSize;
    size_t dictID;
    size_t eSize;
    ZSTD_STATIC_ASSERT(HUF_WORKSPACE_SIZE >= (1<<MAX(MLFSELog,LLFSELog)));
    assert(dictSize >= 8);
    assert(MEM_readLE32(dictPtr) == ZSTD_MAGIC_DICTIONARY);

    dictID = params->fParams.noDictIDFlag ? 0 :  MEM_readLE32(dictPtr + 4 /* skip magic number */ );
    eSize = ZSTD_loadCEntropy(bs, workspace, dict, dictSize);
    FORWARD_IF_ERROR(eSize, "ZSTD_loadCEntropy failed");
    dictPtr += eSize;

    {
        size_t const dictContentSize = (size_t)(dictEnd - dictPtr);
        FORWARD_IF_ERROR(ZSTD_loadDictionaryContent(
            ms, NULL, ws, params, dictPtr, dictContentSize, dtlm, tfp), "");
    }
    return dictID;
}